

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<SafeSymbols>::copyAppend
          (QGenericArrayOps<SafeSymbols> *this,SafeSymbols *b,SafeSymbols *e)

{
  qsizetype *pqVar1;
  SafeSymbols *pSVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<SafeSymbols>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<SafeSymbols>).size;
      pDVar4 = (b->symbols).d.d;
      pSVar2[lVar3].symbols.d.d = pDVar4;
      pSVar2[lVar3].symbols.d.ptr = (b->symbols).d.ptr;
      pSVar2[lVar3].symbols.d.size = (b->symbols).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar5 = (b->expandedMacro).d.d;
      pSVar2[lVar3].expandedMacro.d.d = pDVar5;
      pSVar2[lVar3].expandedMacro.d.ptr = (b->expandedMacro).d.ptr;
      pSVar2[lVar3].expandedMacro.d.size = (b->expandedMacro).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (b->excludedSymbols).q_hash.d;
      pSVar2[lVar3].excludedSymbols.q_hash.d = pDVar6;
      if ((pDVar6 != (Data *)0x0) &&
         ((pDVar6->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar6->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar6->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar2[lVar3].index = b->index;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<SafeSymbols>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }